

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dblk_compr.c
# Opt level: O3

void GenerateReverseLUT_16(UINT32 dstLen,UINT16 *dstLUT,UINT32 srcLen,UINT16 *srcLUT)

{
  ushort uVar1;
  ulong uVar2;
  UINT16 UVar3;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar4;
  
  memset(dstLUT,0,(ulong)(dstLen * 2));
  if (srcLen != 0) {
    uVar2 = 0;
    do {
      if (srcLUT[uVar2] < dstLen) {
        dstLUT[srcLUT[uVar2]] = (UINT16)uVar2;
      }
      uVar2 = uVar2 + 1;
    } while (srcLen != uVar2);
  }
  if (dstLen != 0) {
    uVar2 = 0;
    do {
      if ((dstLUT[uVar2] == 0) && (uVar2 != *srcLUT)) {
        uVar4 = 0;
        UVar3 = 0;
        if (srcLen != 0) {
          uVar6 = 0xffff;
          uVar5 = 0;
          do {
            uVar1 = srcLUT[uVar5];
            uVar7 = (uint)uVar1 - (int)uVar2;
            if (uVar1 < uVar2) {
              uVar7 = (int)uVar2 - (uint)uVar1;
            }
            if ((uVar7 < uVar6) || ((uVar2 < uVar1 && (uVar6 == uVar7)))) {
              uVar4 = uVar5 & 0xffffffff;
              uVar6 = uVar7;
            }
            UVar3 = (UINT16)uVar4;
            uVar5 = uVar5 + 1;
          } while (srcLen != uVar5);
        }
        dstLUT[uVar2] = UVar3;
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 != dstLen);
  }
  return;
}

Assistant:

void GenerateReverseLUT_16(UINT32 dstLen, UINT16* dstLUT, UINT32 srcLen, const UINT16* srcLUT)
{
	UINT32 curSrc;
	UINT32 curDst;
	FUINT16 dist;
	UINT32 minIdx;
	FUINT16 minDist;
	
	memset(dstLUT, 0x00, dstLen * 0x02);
	for (curSrc = 0x00; curSrc < srcLen; curSrc ++)
	{
		if (srcLUT[curSrc] < dstLen)
			dstLUT[srcLUT[curSrc]] = (UINT16)curSrc;
	}
	
	for (curDst = 0x00; curDst < dstLen; curDst ++)
	{
		if (! dstLUT[curDst] && srcLUT[0] != curDst)
		{
			minDist = 0xFFFF;
			minIdx = 0x00;
			for (curSrc = 0x00; curSrc < srcLen; curSrc ++)
			{
				dist = (curDst > srcLUT[curSrc]) ? (curDst - srcLUT[curSrc]) : (srcLUT[curSrc] - curDst);
				// The second condition results in more algorithm-like rounding.
				if (minDist > dist || (minDist == dist && (curDst < srcLUT[curSrc])))
				{
					minDist = dist;
					minIdx = curSrc;
				}
			}
			dstLUT[curDst] = (UINT16)minIdx;
		}
	}
	
	return;
}